

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O0

int ExtractMetadataFromPNG
              (png_structp png,png_infop head_info,png_infop end_info,Metadata *metadata)

{
  int iVar1;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  png_uint_32 len;
  png_bytep profile;
  int comp_type;
  png_charp name;
  png_size_t text_length;
  MetadataPayload *payload;
  int j;
  png_uint_32 i;
  png_uint_32 num;
  png_textp text;
  png_infop info;
  int p;
  MetadataPayload *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *metadata_00;
  undefined1 local_7c [4];
  undefined1 local_78 [12];
  undefined1 local_6c [4];
  undefined1 local_68 [8];
  size_t local_60;
  MetadataPayload *local_58;
  int local_4c;
  uint local_48;
  uint local_44;
  int *local_40;
  char *local_38;
  int local_2c;
  long local_28;
  char *local_20;
  char *local_18;
  undefined8 local_10;
  
  local_2c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (1 < local_2c) {
      return 1;
    }
    metadata_00 = local_20;
    if (local_2c == 0) {
      metadata_00 = local_18;
    }
    local_40 = (int *)0x0;
    local_38 = metadata_00;
    local_44 = png_get_text(local_10,metadata_00,&local_40,0);
    for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
      local_4c = 0;
      while (kPNGMetadataMap[local_4c].name != (char *)0x0) {
        iVar1 = strcmp(*(char **)(local_40 + 2),kPNGMetadataMap[local_4c].name);
        if (iVar1 == 0) {
          local_58 = (MetadataPayload *)(local_28 + kPNGMetadataMap[local_4c].storage_offset);
          in_stack_ffffffffffffff74 = *local_40;
          if ((in_stack_ffffffffffffff74 + 1U < 2) ||
             (in_stack_ffffffffffffff74 != 1 && in_stack_ffffffffffffff74 != 2)) {
            local_60 = *(size_t *)(local_40 + 6);
          }
          else {
            local_60 = *(size_t *)(local_40 + 8);
          }
          if (local_58->bytes == (uint8_t *)0x0) {
            iVar1 = (*kPNGMetadataMap[local_4c].process)(*(char **)(local_40 + 4),local_60,local_58)
            ;
            if (iVar1 == 0) {
              fprintf(_stderr,"Failed to process: \'%s\'\n",*(undefined8 *)(local_40 + 2));
              return 0;
            }
          }
          else {
            fprintf(_stderr,"Ignoring additional \'%s\'\n",*(undefined8 *)(local_40 + 2));
          }
          break;
        }
        local_4c = local_4c + 1;
      }
      local_40 = local_40 + 0xe;
    }
    iVar1 = png_get_iCCP(local_10,local_38,local_68,local_6c,local_78,local_7c);
    if ((iVar1 == 0x1000) &&
       (iVar1 = MetadataCopy(metadata_00,
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff68), iVar1 == 0)) {
      return 0;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static int ExtractMetadataFromPNG(png_structp png,
                                  png_infop const head_info,
                                  png_infop const end_info,
                                  Metadata* const metadata) {
  int p;

  for (p = 0; p < 2; ++p)  {
    png_infop const info = (p == 0) ? head_info : end_info;
    png_textp text = NULL;
    const png_uint_32 num = png_get_text(png, info, &text, NULL);
    png_uint_32 i;
    // Look for EXIF / XMP metadata.
    for (i = 0; i < num; ++i, ++text) {
      int j;
      for (j = 0; kPNGMetadataMap[j].name != NULL; ++j) {
        if (!strcmp(text->key, kPNGMetadataMap[j].name)) {
          MetadataPayload* const payload =
              (MetadataPayload*)((uint8_t*)metadata +
                                 kPNGMetadataMap[j].storage_offset);
          png_size_t text_length;
          switch (text->compression) {
#ifdef PNG_iTXt_SUPPORTED
            case PNG_ITXT_COMPRESSION_NONE:
            case PNG_ITXT_COMPRESSION_zTXt:
              text_length = text->itxt_length;
              break;
#endif
            case PNG_TEXT_COMPRESSION_NONE:
            case PNG_TEXT_COMPRESSION_zTXt:
            default:
              text_length = text->text_length;
              break;
          }
          if (payload->bytes != NULL) {
            fprintf(stderr, "Ignoring additional '%s'\n", text->key);
          } else if (!kPNGMetadataMap[j].process(text->text, text_length,
                                                 payload)) {
            fprintf(stderr, "Failed to process: '%s'\n", text->key);
            return 0;
          }
          break;
        }
      }
    }
    // Look for an ICC profile.
    {
      png_charp name;
      int comp_type;
#if LOCAL_PNG_PREREQ(1,5)
      png_bytep profile;
#else
      png_charp profile;
#endif
      png_uint_32 len;

      if (png_get_iCCP(png, info,
                       &name, &comp_type, &profile, &len) == PNG_INFO_iCCP) {
        if (!MetadataCopy((const char*)profile, len, &metadata->iccp)) return 0;
      }
    }
  }
  return 1;
}